

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O0

void __thiscall FBX::Stream::Stream(Stream *this,string *path)

{
  char *pcVar1;
  runtime_error *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  undefined1 auStack_108 [4];
  int file;
  stat st;
  string local_70 [35];
  undefined1 local_4d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *temp;
  string *path_local;
  Stream *this_local;
  
  temp = (char *)path;
  path_local = &this->path;
  std::__cxx11::string::string((string *)this);
  this->cursor = 0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = realpath(pcVar1,(char *)0x0);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    local_4d = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_40,"Failed to open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)temp);
    std::runtime_error::runtime_error(prVar2,(string *)&local_40);
    local_4d = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar1,(allocator<char> *)((long)st.__glibc_reserved + 0x17));
  std::__cxx11::string::operator=((string *)this,local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)st.__glibc_reserved + 0x17));
  free(local_20);
  st.__glibc_reserved[0] = 0;
  st.__glibc_reserved[1] = 0;
  st.st_ctim.tv_sec = 0;
  st.st_ctim.tv_nsec = 0;
  st.st_mtim.tv_sec = 0;
  st.st_mtim.tv_nsec = 0;
  st.st_atim.tv_sec = 0;
  st.st_atim.tv_nsec = 0;
  st.st_blksize = 0;
  st.st_blocks = 0;
  st.st_rdev = 0;
  st.st_size = 0;
  st.st_mode = 0;
  st.st_uid = 0;
  st.st_gid = 0;
  st.__pad0 = 0;
  st.st_ino = 0;
  st.st_nlink = 0;
  _auStack_108 = 0;
  st.st_dev = 0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  stat(pcVar1,(stat *)auStack_108);
  this->fileSize = st.st_rdev;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_10c = open(pcVar1,0);
  if (local_10c == -1) {
    local_131 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_130,"Failed to open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)temp);
    std::runtime_error::runtime_error(prVar2,(string *)&local_130);
    local_131 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (char *)mmap((void *)0x0,this->fileSize,1,2,local_10c,0);
  this->data = pcVar1;
  if (this->data == (char *)0xffffffffffffffff) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_158,"Failed to map file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)temp);
    std::runtime_error::runtime_error(prVar2,(string *)&local_158);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Stream::Stream(const std::string &path) {
#if defined(__unix__) || defined(__APPLE__)
        char *temp = realpath(path.c_str(), nullptr);
        if (!temp)
            throw std::runtime_error("Failed to open file " + path);

        this->path = std::string(temp);
        free(temp);

        struct stat st{};
        stat(this->path.c_str(), &st);
        fileSize = st.st_size;
        int file = open(this->path.c_str(), O_RDONLY, 0);
        if (file == -1)
            throw std::runtime_error("Failed to open file " + path);

        data = static_cast<char *>(mmap(nullptr, fileSize, PROT_READ, MAP_PRIVATE, file, 0));
        if (data == MAP_FAILED)
            throw std::runtime_error("Failed to map file " + path);
#elif __WIN32__
        auto buffer = new char[512];
        GetFullPathName(path.c_str(), 512, buffer, nullptr);
        this->path = reinterpret_cast<const char *>(buffer);

        file = CreateFile(
                this->path.c_str(),
                GENERIC_READ,
                0,
                nullptr,
                OPEN_EXISTING,
                0,
                nullptr
        );
        if (!file)
            throw std::runtime_error("Failed to open file " + path);

        map = CreateFileMapping(file, nullptr, PAGE_READONLY, 0, 0, nullptr);
        if (!map) {
            CloseHandle(file);
            throw std::runtime_error("Failed to create file mapping " + path);
        }

        data = (char *) MapViewOfFile(map, FILE_MAP_READ, 0, 0, 0);
        if (!data) {
            CloseHandle(map);
            CloseHandle(file);
            throw std::runtime_error("Failed to memory map file " + path);
        }
#endif
    }